

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dag.cpp
# Opt level: O0

bool __thiscall DAGPropagator::propagate(DAGPropagator *this)

{
  bool bVar1;
  int iVar2;
  vector<bool,_std::allocator<bool>_> *this_00;
  reference piVar3;
  ulong uVar4;
  vector<bool,_std::allocator<bool>_> *in_RDI;
  iterator it;
  _Bit_pointer *in_stack_fffffffffffffef8;
  _Bit_pointer *in_stack_ffffffffffffff00;
  allocator_type *in_stack_ffffffffffffff08;
  allocator_type *__a;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff10;
  size_type in_stack_ffffffffffffff18;
  undefined1 *__n;
  reference local_c8;
  _Self local_b8;
  _Base_ptr local_b0;
  reference local_a8;
  _Self in_stack_ffffffffffffff68;
  _Rb_tree_const_iterator<int> local_88;
  undefined1 local_7a;
  undefined1 local_79;
  undefined1 local_39;
  allocator_type local_38 [55];
  bool local_1;
  
  GraphPropagator::nbEdges((GraphPropagator *)0x20c501);
  local_39 = 0;
  std::allocator<bool>::allocator((allocator<bool> *)0x20c522);
  std::vector<bool,_std::allocator<bool>_>::vector
            (in_RDI,in_stack_ffffffffffffff18,(bool *)in_stack_ffffffffffffff10,
             in_stack_ffffffffffffff08);
  __a = local_38;
  std::vector<bool,_std::allocator<bool>_>::operator=
            (in_stack_ffffffffffffff10,(vector<bool,_std::allocator<bool>_> *)__a);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x20c56b)
  ;
  std::allocator<bool>::~allocator((allocator<bool> *)0x20c578);
  iVar2 = GraphPropagator::nbNodes((GraphPropagator *)0x20c582);
  this_00 = (vector<bool,_std::allocator<bool>_> *)(long)iVar2;
  local_79 = 0;
  __n = &local_7a;
  std::allocator<bool>::allocator((allocator<bool> *)0x20c5a3);
  std::vector<bool,_std::allocator<bool>_>::vector(in_RDI,(size_type)__n,(bool *)this_00,__a);
  std::vector<bool,_std::allocator<bool>_>::operator=
            (this_00,(vector<bool,_std::allocator<bool>_> *)__a);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x20c5ea)
  ;
  std::allocator<bool>::~allocator((allocator<bool> *)0x20c5f7);
  bVar1 = DReachabilityPropagator::propagate
                    ((DReachabilityPropagator *)in_stack_ffffffffffffff68._M_node);
  if (bVar1) {
    std::_Rb_tree_const_iterator<int>::_Rb_tree_const_iterator(&local_88);
    local_88._M_node =
         (_Base_ptr)
         std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffef8);
    while( true ) {
      std::set<int,_std::less<int>,_std::allocator<int>_>::end
                ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffef8);
      bVar1 = std::operator!=(&local_88,(_Self *)&stack0xffffffffffffff68);
      if (!bVar1) break;
      in_stack_ffffffffffffff00 =
           &in_RDI[0xc].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_end_of_storage;
      std::_Rb_tree_const_iterator<int>::operator*((_Rb_tree_const_iterator<int> *)0x20c6dc);
      local_a8 = std::vector<bool,_std::allocator<bool>_>::operator[](in_RDI,(size_type)__n);
      bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_a8);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        piVar3 = std::_Rb_tree_const_iterator<int>::operator*
                           ((_Rb_tree_const_iterator<int> *)0x20c712);
        uVar4 = (*(code *)(in_RDI->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[0x11])
                          (in_RDI,*piVar3);
        if ((uVar4 & 1) == 0) {
          return false;
        }
      }
      std::_Rb_tree_const_iterator<int>::operator++
                ((_Rb_tree_const_iterator<int> *)in_stack_ffffffffffffff00);
    }
    local_b0 = (_Base_ptr)
               std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)
                          in_stack_fffffffffffffef8);
    local_88._M_node = local_b0;
    while( true ) {
      local_b8._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::end
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffffef8);
      bVar1 = std::operator!=(&local_88,&local_b8);
      if (!bVar1) break;
      in_stack_fffffffffffffef8 =
           &in_RDI[0xd].super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_end_of_storage;
      std::_Rb_tree_const_iterator<int>::operator*((_Rb_tree_const_iterator<int> *)0x20c7b9);
      local_c8 = std::vector<bool,_std::allocator<bool>_>::operator[](in_RDI,(size_type)__n);
      bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_c8);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        piVar3 = std::_Rb_tree_const_iterator<int>::operator*
                           ((_Rb_tree_const_iterator<int> *)0x20c7ee);
        uVar4 = (*(code *)(in_RDI->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[0x14])
                          (in_RDI,*piVar3);
        if ((uVar4 & 1) == 0) {
          return false;
        }
      }
      std::_Rb_tree_const_iterator<int>::operator++
                ((_Rb_tree_const_iterator<int> *)in_stack_ffffffffffffff00);
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool DAGPropagator::propagate() {
	processed_e = std::vector<bool>(nbEdges(), false);
	processed_n = std::vector<bool>(nbNodes(), false);

	if (!DReachabilityPropagator::propagate()) {
		return false;
	}

	std::set<int>::iterator it;

	for (it = new_edge.begin(); it != new_edge.end(); ++it) {
		if (!processed_e[*it]) {
			if (!propagateNewEdge(*it)) {
				return false;
			}
		}
	}

	for (it = new_node.begin(); it != new_node.end(); ++it) {
		if (!processed_n[*it]) {
			if (!propagateNewNode(*it)) {
				return false;
			}
		}
	}

	return true;
}